

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3DecOrHexToI64(char *z,i64 *pOut)

{
  byte bVar1;
  uint uVar2;
  long *in_RSI;
  i64 *in_RDI;
  int k;
  int i;
  u64 u;
  int local_28;
  int local_24;
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((char)*in_RDI == '0') &&
     (((*(char *)((long)in_RDI + 1) == 'x' || (*(char *)((long)in_RDI + 1) == 'X')) &&
      ((""[*(byte *)((long)in_RDI + 2)] & 8) != 0)))) {
    local_20 = 0;
    for (local_24 = 2; *(char *)((long)in_RDI + (long)local_24) == '0'; local_24 = local_24 + 1) {
    }
    local_28 = local_24;
    while ((""[*(byte *)((long)in_RDI + (long)local_28)] & 8) != 0) {
      bVar1 = sqlite3HexToInt((int)*(char *)((long)in_RDI + (long)local_28));
      local_20 = local_20 * 0x10 + (ulong)bVar1;
      local_28 = local_28 + 1;
    }
    *in_RSI = local_20;
    uVar2 = (uint)(*(char *)((long)in_RDI + (long)local_28) != '\0' || 0x10 < local_28 - local_24);
  }
  else {
    sqlite3Strlen30((char *)in_RDI);
    uVar2 = sqlite3Atoi64((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI,(int)((ulong)in_RSI >> 0x20),(u8)((ulong)in_RSI >> 0x18));
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3DecOrHexToI64(const char *z, i64 *pOut){
#ifndef SQLITE_OMIT_HEX_INTEGER
  if( z[0]=='0'
   && (z[1]=='x' || z[1]=='X')
   && sqlite3Isxdigit(z[2])
  ){
    u64 u = 0;
    int i, k;
    for(i=2; z[i]=='0'; i++){}
    for(k=i; sqlite3Isxdigit(z[k]); k++){
      u = u*16 + sqlite3HexToInt(z[k]);
    }
    memcpy(pOut, &u, 8);
    return (z[k]==0 && k-i<=16) ? 0 : 1;
  }else
#endif /* SQLITE_OMIT_HEX_INTEGER */
  {
    return sqlite3Atoi64(z, pOut, sqlite3Strlen30(z), SQLITE_UTF8);
  }
}